

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
Parser_attemptToParse20ModelWithPermissiveParser_Test::
Parser_attemptToParse20ModelWithPermissiveParser_Test
          (Parser_attemptToParse20ModelWithPermissiveParser_Test *this)

{
  Parser_attemptToParse20ModelWithPermissiveParser_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Parser_attemptToParse20ModelWithPermissiveParser_Test_00184ec0;
  return;
}

Assistant:

TEST(Parser, attemptToParse20ModelWithPermissiveParser)
{
    const std::string n = "name";
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"name\"/>\n";

    libcellml::ParserPtr parser = libcellml::Parser::create(false);
    libcellml::ModelPtr model = parser->parseModel(e);

    EXPECT_EQ("name", model->name());
    EXPECT_EQ(size_t(0), parser->issueCount());
}